

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void anon_unknown.dwarf_30b7b8::log_stack_error(Node *stack,Attribute *attr)

{
  ostream *poVar1;
  string local_2c0;
  Log local_2a0;
  cali_variant_t local_98;
  string local_88;
  string local_58 [8];
  string helpstr;
  string stackstr;
  Attribute *attr_local;
  Node *stack_local;
  
  std::__cxx11::string::string((string *)(helpstr.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_58);
  if (stack == (Node *)0x0) {
    std::__cxx11::string::operator=
              ((string *)(helpstr.field_2._M_local_buf + 8)," but region stack is empty!");
  }
  else {
    std::__cxx11::string::operator=
              ((string *)(helpstr.field_2._M_local_buf + 8)," but current region is \"");
    local_98 = (cali_variant_t)cali::Node::data(stack);
    cali::Variant::to_string_abi_cxx11_(&local_88,(Variant *)&local_98);
    std::__cxx11::string::append((string *)(helpstr.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::append(helpstr.field_2._M_local_buf + 8);
  }
  cali::Log::Log(&local_2a0,0);
  poVar1 = cali::Log::stream(&local_2a0);
  poVar1 = std::operator<<(poVar1,"Region stack mismatch: Trying to end \"");
  cali::Attribute::name_abi_cxx11_(&local_2c0,attr);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)(helpstr.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1,"\n  Ceasing region tracking!");
  poVar1 = std::operator<<(poVar1,local_58);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2c0);
  cali::Log::~Log(&local_2a0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(helpstr.field_2._M_local_buf + 8));
  return;
}

Assistant:

void log_stack_error(const Node* stack, const Attribute& attr)
{
    std::string stackstr;
    std::string helpstr;

    if (stack) {
        stackstr = " but current region is \"";
        stackstr.append(stack->data().to_string());
        stackstr.append("\".");
    } else
        stackstr = " but region stack is empty!";

    Log(0).stream() << "Region stack mismatch: Trying to end \"" << attr.name() << "\"" << stackstr
                    << "\n  Ceasing region tracking!" << helpstr << std::endl;
}